

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

archive_wstring * archive_wstring_append(archive_wstring *as,wchar_t *p,size_t s)

{
  archive_string *paVar1;
  size_t sVar2;
  
  paVar1 = archive_string_ensure((archive_string *)as,(as->length + s) * 4 + 4);
  if (paVar1 == (archive_string *)0x0) {
    as = (archive_wstring *)0x0;
  }
  else {
    wmemcpy(as->s + as->length,p,s);
    sVar2 = s + as->length;
    as->length = sVar2;
    as->s[sVar2] = L'\0';
  }
  return as;
}

Assistant:

static struct archive_wstring *
archive_wstring_append(struct archive_wstring *as, const wchar_t *p, size_t s)
{
	if (archive_wstring_ensure(as, as->length + s + 1) == NULL)
		return (NULL);
	wmemcpy(as->s + as->length, p, s);
	as->length += s;
	as->s[as->length] = 0;
	return (as);
}